

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLGrammarPoolImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLGrammarPoolImpl::serializeGrammars(XMLGrammarPoolImpl *this,BinOutputStream *binOut)

{
  XSerializationException *this_00;
  RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> grammarEnum;
  XSerializeEngine serEng;
  
  RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
  RefHashTableOfEnumerator
            (&grammarEnum,this->fGrammarRegistry,false,(this->super_XMLGrammarPool).fMemMgr);
  if ((grammarEnum.fCurElem == (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0) &&
     (grammarEnum.fCurHash == (grammarEnum.fToEnum)->fHashModulus)) {
    this_00 = (XSerializationException *)__cxa_allocate_exception(0x30);
    XSerializationException::XSerializationException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/framework/XMLGrammarPoolImpl.cpp"
               ,0xf3,XSer_GrammarPool_Empty,(this->super_XMLGrammarPool).fMemMgr);
    __cxa_throw(this_00,&XSerializationException::typeinfo,XMLException::~XMLException);
  }
  XSerializeEngine::XSerializeEngine(&serEng,binOut,&this->super_XMLGrammarPool,0x2000);
  XSerializeEngine::operator<<(&serEng,7);
  XSerializeEngine::operator<<(&serEng,this->fLocked);
  (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[3])(this->fStringPool,&serEng);
  XTemplateSerializer::storeObject(this->fGrammarRegistry,&serEng);
  XSerializeEngine::~XSerializeEngine(&serEng);
  RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
  ~RefHashTableOfEnumerator(&grammarEnum);
  return;
}

Assistant:

void XMLGrammarPoolImpl::serializeGrammars(BinOutputStream* const binOut)
{
    RefHashTableOfEnumerator<Grammar> grammarEnum(fGrammarRegistry, false, getMemoryManager());
    if (!(grammarEnum.hasMoreElements()))
    {
        ThrowXMLwithMemMgr(XSerializationException, XMLExcepts::XSer_GrammarPool_Empty, getMemoryManager());
    }

    XSerializeEngine  serEng(binOut, this);

    //version information
    serEng<<(unsigned int)XERCES_GRAMMAR_SERIALIZATION_LEVEL;

    //lock status
    serEng<<fLocked;

    //StringPool, don't use <<
    fStringPool->serialize(serEng);

    /***
     * Serialize RefHashTableOf<Grammar>*    fGrammarRegistry;
     ***/
    XTemplateSerializer::storeObject(fGrammarRegistry, serEng);
}